

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-world.c
# Opt level: O3

void play_ambient_sound(void)

{
  ushort uVar1;
  wchar_t t;
  
  uVar1 = player->depth;
  if (uVar1 == 0) {
    sound(((long)((ulong)z_info->day_length * 5) <=
          (long)(turn % (int)((uint)z_info->day_length * 10))) + 0x83);
    return;
  }
  t = L'\x85';
  if (((0x14 < (short)uVar1) && (t = L'\x86', 0x28 < uVar1)) && (t = L'\x87', 0x3c < uVar1)) {
    sound(0x89 - (uint)(uVar1 < 0x51));
    return;
  }
  if ((player->opts).opt[2] == true) {
    event_signal_message(EVENT_SOUND,t,(char *)0x0);
    return;
  }
  return;
}

Assistant:

void play_ambient_sound(void)
{
	if (player->depth == 0) {
		if (is_daytime())
			sound(MSG_AMBIENT_DAY);
		else 
			sound(MSG_AMBIENT_NITE);
	} else if (player->depth <= 20) {
		sound(MSG_AMBIENT_DNG1);
	} else if (player->depth <= 40) {
		sound(MSG_AMBIENT_DNG2);
	} else if (player->depth <= 60) {
		sound(MSG_AMBIENT_DNG3);
	} else if (player->depth <= 80) {
		sound(MSG_AMBIENT_DNG4);
	} else {
		sound(MSG_AMBIENT_DNG5);
	}
}